

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::process_request
          (Server *this,Stream *strm,bool last_connection,bool *connection_close,
          function<void_(httplib::Request_&)> *setup_request)

{
  array<char,_2048UL> *this_00;
  bool bVar1;
  pointer fixed_buffer;
  FILE *__stream;
  ulong uVar2;
  size_t sVar3;
  char *s;
  size_t *__n;
  Stream *strm_00;
  bool local_cb7;
  function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)> local_c70;
  anon_class_40_5_722b80d5 local_c50;
  undefined1 local_c28 [8];
  ContentReader content_reader;
  string *range_header_value;
  byte local_bb9;
  string local_bb8;
  string local_b98;
  undefined1 local_b78 [8];
  Headers dummy;
  Response res;
  Request req;
  undefined1 local_878 [8];
  stream_line_reader line_reader;
  array<char,_2048UL> buf;
  function<void_(httplib::Request_&)> *setup_request_local;
  bool *connection_close_local;
  Stream *pSStack_20;
  bool last_connection_local;
  Stream *strm_local;
  Server *this_local;
  
  this_00 = (array<char,_2048UL> *)(&line_reader.glowable_buffer_.field_2._M_allocated_capacity + 1)
  ;
  connection_close_local._7_1_ = last_connection;
  pSStack_20 = strm;
  strm_local = (Stream *)this;
  memset(this_00,0,0x800);
  strm_00 = pSStack_20;
  fixed_buffer = std::array<char,_2048UL>::data(this_00);
  __stream = (FILE *)std::array<char,_2048UL>::size(this_00);
  detail::stream_line_reader::stream_line_reader
            ((stream_line_reader *)local_878,strm_00,fixed_buffer,(size_t)__stream);
  uVar2 = detail::stream_line_reader::getline
                    ((stream_line_reader *)local_878,(char **)strm_00,__n,__stream);
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = 0;
    req.content_provider._M_invoker._0_4_ = 1;
  }
  else {
    Request::Request((Request *)&res.content_provider_resource_releaser._M_invoker);
    Response::Response((Response *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::operator=
              ((string *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count,"HTTP/1.1");
    sVar3 = detail::stream_line_reader::size((stream_line_reader *)local_878);
    if (sVar3 < 0x2001) {
      s = detail::stream_line_reader::ptr((stream_line_reader *)local_878);
      bVar1 = parse_request_line(this,s,(Request *)
                                        &res.content_provider_resource_releaser._M_invoker);
      if ((bVar1) &&
         (bVar1 = detail::read_headers(pSStack_20,(Headers *)((long)&req.path.field_2 + 8)), bVar1))
      {
        Request::get_header_value_abi_cxx11_
                  (&local_b98,(Request *)&res.content_provider_resource_releaser._M_invoker,
                   "Connection",0);
        bVar1 = std::operator==(&local_b98,"close");
        std::__cxx11::string::~string((string *)&local_b98);
        if (bVar1) {
          *connection_close = true;
        }
        local_bb9 = 0;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&req.body.field_2 + 8),"HTTP/1.0");
        local_cb7 = false;
        if (bVar1) {
          Request::get_header_value_abi_cxx11_
                    (&local_bb8,(Request *)&res.content_provider_resource_releaser._M_invoker,
                     "Connection",0);
          local_bb9 = 1;
          local_cb7 = std::operator!=(&local_bb8,"Keep-Alive");
        }
        if ((local_bb9 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_bb8);
        }
        if (local_cb7 != false) {
          *connection_close = true;
        }
        (*pSStack_20->_vptr_Stream[6])(&range_header_value);
        Request::set_header((Request *)&res.content_provider_resource_releaser._M_invoker,
                            "REMOTE_ADDR",(string *)&range_header_value);
        std::__cxx11::string::~string((string *)&range_header_value);
        bVar1 = Request::has_header((Request *)&res.content_provider_resource_releaser._M_invoker,
                                    "Range");
        if (bVar1) {
          Request::get_header_value_abi_cxx11_
                    ((string *)&content_reader._M_invoker,
                     (Request *)&res.content_provider_resource_releaser._M_invoker,"Range",0);
          detail::parse_range_header
                    ((string *)&content_reader._M_invoker,
                     (Ranges *)&req.files._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::__cxx11::string::~string((string *)&content_reader._M_invoker);
        }
        bVar1 = std::function::operator_cast_to_bool((function *)setup_request);
        if (bVar1) {
          std::function<void_(httplib::Request_&)>::operator()
                    (setup_request,(Request *)&res.content_provider_resource_releaser._M_invoker);
        }
        local_c50.req = (Request *)&res.content_provider_resource_releaser._M_invoker;
        local_c50.strm = pSStack_20;
        local_c50.last_connection = (bool *)((long)&connection_close_local + 7);
        local_c50.res = (Response *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_c50.this = this;
        std::function<bool(std::function<bool(char_const*,unsigned_long)>)>::
        function<httplib::Server::process_request(httplib::Stream&,bool,bool&,std::function<void(httplib::Request&)>const&)::_lambda(std::function<bool(char_const*,unsigned_long)>)_1_,void>
                  ((function<bool(std::function<bool(char_const*,unsigned_long)>)> *)local_c28,
                   &local_c50);
        std::function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)>::function
                  (&local_c70,
                   (function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)> *)local_c28);
        bVar1 = routing(this,(Request *)&res.content_provider_resource_releaser._M_invoker,
                        (Response *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_c70);
        std::function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)>::~function
                  (&local_c70);
        if (bVar1) {
          if (res.version.field_2._8_4_ == -1) {
            bVar1 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::
                    empty((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                          &req.files._M_t._M_impl.super__Rb_tree_header._M_node_count);
            res.version.field_2._8_4_ = 0xce;
            if (bVar1) {
              res.version.field_2._8_4_ = 200;
            }
          }
        }
        else if (res.version.field_2._8_4_ == -1) {
          res.version.field_2._8_4_ = 0x194;
        }
        this_local._7_1_ =
             write_response(this,pSStack_20,(bool)(connection_close_local._7_1_ & 1),
                            (Request *)&res.content_provider_resource_releaser._M_invoker,
                            (Response *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count);
        req.content_provider._M_invoker._0_4_ = 1;
        std::function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)>::~function
                  ((function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)> *)local_c28);
      }
      else {
        res.version.field_2._8_4_ = 400;
        this_local._7_1_ =
             write_response(this,pSStack_20,(bool)(connection_close_local._7_1_ & 1),
                            (Request *)&res.content_provider_resource_releaser._M_invoker,
                            (Response *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count);
        req.content_provider._M_invoker._0_4_ = 1;
      }
    }
    else {
      std::
      multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_b78);
      detail::read_headers
                (pSStack_20,
                 (multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_b78);
      res.version.field_2._8_4_ = 0x19e;
      this_local._7_1_ =
           write_response(this,pSStack_20,(bool)(connection_close_local._7_1_ & 1),
                          (Request *)&res.content_provider_resource_releaser._M_invoker,
                          (Response *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count);
      req.content_provider._M_invoker._0_4_ = 1;
      std::
      multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_b78);
    }
    Response::~Response((Response *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count);
    Request::~Request((Request *)&res.content_provider_resource_releaser._M_invoker);
  }
  detail::stream_line_reader::~stream_line_reader((stream_line_reader *)local_878);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool
Server::process_request(Stream &strm, bool last_connection,
                        bool &connection_close,
                        const std::function<void(Request &)>& setup_request) {
  std::array<char, 2048> buf{};

  detail::stream_line_reader line_reader(strm, buf.data(), buf.size());

  // Connection has been closed on client
  if (!line_reader.getline()) { return false; }

  Request req;
  Response res;

  res.version = "HTTP/1.1";

  // Check if the request URI doesn't exceed the limit
  if (line_reader.size() > CPPHTTPLIB_REQUEST_URI_MAX_LENGTH) {
    Headers dummy;
    detail::read_headers(strm, dummy);
    res.status = 414;
    return write_response(strm, last_connection, req, res);
  }

  // Request line and headers
  if (!parse_request_line(line_reader.ptr(), req) ||
      !detail::read_headers(strm, req.headers)) {
    res.status = 400;
    return write_response(strm, last_connection, req, res);
  }

  if (req.get_header_value("Connection") == "close") {
    connection_close = true;
  }

  if (req.version == "HTTP/1.0" &&
      req.get_header_value("Connection") != "Keep-Alive") {
    connection_close = true;
  }

  req.set_header("REMOTE_ADDR", strm.get_remote_addr());

  if (req.has_header("Range")) {
    const auto &range_header_value = req.get_header_value("Range");
    if (!detail::parse_range_header(range_header_value, req.ranges)) {
      // TODO: error
    }
  }

  if (setup_request) { setup_request(req); }

  // Body
  ContentReader content_reader = [&](ContentReceiver receiver) {
    if (req.method == "POST" || req.method == "PUT" || req.method == "PATCH") {
      if (receiver) {
        return read_content_with_content_receiver(strm, last_connection, req,
                                                  res, receiver);
      } else {
        return read_content(strm, last_connection, req, res);
      }
    } else if (req.method == "PRI") {
      return read_content(strm, last_connection, req, res);
    }
    return true;
  };

  // Rounting
  if (routing(req, res, content_reader)) {
    if (res.status == -1) { res.status = req.ranges.empty() ? 200 : 206; }
  } else {
    if (res.status == -1) { res.status = 404; }
  }

  return write_response(strm, last_connection, req, res);
}